

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_singleton.c
# Opt level: O0

log_singleton log_singleton_instance_impl(void)

{
  int iVar1;
  log_singleton *pplVar2;
  log_singleton plVar3;
  log_singleton *singleton_ptr;
  portability_atexit_fn in_stack_00000008;
  
  pplVar2 = log_singleton_instance();
  if (*pplVar2 == (log_singleton)0x0) {
    plVar3 = log_singleton_create();
    *pplVar2 = plVar3;
    if (*pplVar2 == (log_singleton)0x0) {
      abort();
    }
    portability_atexit_initialize();
    iVar1 = portability_atexit_register(in_stack_00000008);
    if (iVar1 != 0) {
      log_singleton_destroy();
      abort();
    }
  }
  return *pplVar2;
}

Assistant:

log_singleton log_singleton_instance_impl(void)
{
	log_singleton *singleton_ptr = log_singleton_instance();

	if (*singleton_ptr == NULL)
	{
		*singleton_ptr = log_singleton_create();

		if (*singleton_ptr == NULL)
		{
			abort();
		}

		/* Initialize at exit handlers */
		portability_atexit_initialize();

		if (portability_atexit_register(&log_atexit_callback) != 0)
		{
			if (log_singleton_destroy() != 0)
			{
				/* ... */
			}

			abort();
		}
	}

	return *singleton_ptr;
}